

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O0

RealType __thiscall
OpenMD::GofROmega::evaluateAngle(GofROmega *this,StuntDouble *sd1,StuntDouble *sd2,StuntDouble *sd3)

{
  bool bVar1;
  undefined8 uVar2;
  Atom *in_RDX;
  Vector<double,_3U> *in_RDI;
  double dVar3;
  MultipoleAdapter ma2;
  AtomType *atype2;
  Vector3d v2;
  Vector3d v1;
  bool usePeriodicBoundaryConditions_;
  Vector3<double> *in_stack_fffffffffffffd98;
  StuntDouble *in_stack_fffffffffffffda0;
  StuntDouble *in_stack_fffffffffffffda8;
  Vector<double,_3U> *in_stack_fffffffffffffdc0;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffdc8;
  SquareMatrix3<double> *in_stack_fffffffffffffdd8;
  MultipoleAdapter *in_stack_fffffffffffffe08;
  _Base_ptr in_stack_fffffffffffffe18;
  Snapshot *in_stack_fffffffffffffe20;
  StuntDouble local_190;
  MultipoleAdapter local_d0;
  AtomType *local_c8;
  string local_c0 [159];
  byte local_21;
  Atom *local_18;
  
  local_18 = in_RDX;
  SimInfo::getSimParams((SimInfo *)in_RDI->data_[1]);
  local_21 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x1513d5);
  Vector3<double>::Vector3((Vector3<double> *)0x1513eb);
  Vector3<double>::Vector3((Vector3<double> *)0x1513f8);
  StuntDouble::getPos(in_stack_fffffffffffffda8);
  StuntDouble::getPos(in_stack_fffffffffffffda8);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffda8,
                    (Vector<double,_3U> *)in_stack_fffffffffffffda0);
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_fffffffffffffda8,
             (Vector<double,_3U> *)in_stack_fffffffffffffda0);
  if ((local_21 & 1) != 0) {
    Snapshot::wrapVector(in_stack_fffffffffffffe20,(Vector3d *)in_stack_fffffffffffffe18);
  }
  bVar1 = StuntDouble::isDirectional(in_stack_fffffffffffffda0);
  if (!bVar1) {
    (*(local_18->super_StuntDouble)._vptr_StuntDouble[7])(local_c0);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"GofROmega: attempted to use a non-directional object: %s\n",uVar2
            );
    std::__cxx11::string::~string(local_c0);
    painCave.isFatal = 1;
    simError();
  }
  bVar1 = StuntDouble::isAtom(&local_18->super_StuntDouble);
  if (bVar1) {
    local_c8 = Atom::getAtomType(local_18);
    MultipoleAdapter::MultipoleAdapter(&local_d0,local_c8);
    bVar1 = MultipoleAdapter::isDipole(in_stack_fffffffffffffe08);
    if (bVar1) {
      StuntDouble::getDipole(in_stack_fffffffffffffda8);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    }
    else {
      in_stack_fffffffffffffda8 = &local_190;
      StuntDouble::getA(in_stack_fffffffffffffda8);
      SquareMatrix3<double>::transpose(in_stack_fffffffffffffdd8);
      OpenMD::operator*(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffda8,
                 (Vector<double,_3U> *)in_stack_fffffffffffffda0);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1515dd);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1515ea);
    }
  }
  else {
    in_stack_fffffffffffffda0 = (StuntDouble *)&stack0xfffffffffffffdb8;
    StuntDouble::getA(in_stack_fffffffffffffda8);
    SquareMatrix3<double>::transpose(in_stack_fffffffffffffdd8);
    OpenMD::operator*(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffda8,
               (Vector<double,_3U> *)in_stack_fffffffffffffda0);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x15169e);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1516a8);
  }
  Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffda0);
  Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffda0);
  dVar3 = dot<double,3u>(in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffda8);
  return dVar3;
}

Assistant:

RealType GofROmega::evaluateAngle(StuntDouble* sd1, StuntDouble* sd2,
                                    StuntDouble* sd3) {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d v1;
    Vector3d v2;

    v1 = sd3->getPos() - sd1->getPos();
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(v1);

    if (!sd2->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofROmega: attempted to use a non-directional object: %s\n",
               sd2->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    if (sd2->isAtom()) {
      AtomType* atype2     = static_cast<Atom*>(sd2)->getAtomType();
      MultipoleAdapter ma2 = MultipoleAdapter(atype2);

      if (ma2.isDipole())
        v2 = sd2->getDipole();
      else
        v2 = sd2->getA().transpose() * V3Z;
    } else {
      v2 = sd2->getA().transpose() * V3Z;
    }

    v1.normalize();
    v2.normalize();
    return dot(v1, v2);
  }